

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmNinjaTargetGenerator::GetObjectFilePath_abi_cxx11_
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,cmSourceFile *source)

{
  ulong uVar1;
  string local_60 [32];
  string *local_40;
  string *objectName;
  undefined1 local_21;
  cmSourceFile *local_20;
  cmSourceFile *source_local;
  cmNinjaTargetGenerator *this_local;
  string *path;
  
  local_21 = 0;
  local_20 = source;
  source_local = (cmSourceFile *)this;
  this_local = (cmNinjaTargetGenerator *)__return_storage_ptr__;
  cmLocalNinjaGenerator::GetHomeRelativeOutputPath_abi_cxx11_
            (__return_storage_ptr__,this->LocalGenerator);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/");
  }
  local_40 = cmGeneratorTarget::GetObjectName_abi_cxx11_
                       ((this->super_cmCommonTargetGenerator).GeneratorTarget,local_20);
  (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
    _vptr_cmLocalGenerator[0xc])
            (local_60,this->LocalGenerator,(this->super_cmCommonTargetGenerator).GeneratorTarget);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_60);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaTargetGenerator::GetObjectFilePath(
  cmSourceFile const* source) const
{
  std::string path = this->LocalGenerator->GetHomeRelativeOutputPath();
  if (!path.empty()) {
    path += "/";
  }
  std::string const& objectName = this->GeneratorTarget->GetObjectName(source);
  path += this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget);
  path += "/";
  path += objectName;
  return path;
}